

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t n)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar2 = size(this);
  sVar3 = CommonFields::growth_left((CommonFields *)this);
  if (n <= sVar3 + sVar2) {
    return;
  }
  if (n < 0x1c0000000000001) {
    uVar4 = (n - 1) / 7 + n;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    resize_impl(this,0xffffffffffffffff >> (~(byte)lVar1 & 0x3f),(n - 1) % 7);
    CommonFields::infoz((CommonFields *)this);
    return;
  }
  HashTableSizeOverflow();
}

Assistant:

void reserve(size_t n) {
    const size_t max_size_before_growth =
        is_soo() ? SooCapacity() : size() + growth_left();
    if (n > max_size_before_growth) {
      if (ABSL_PREDICT_FALSE(n > max_size())) {
        HashTableSizeOverflow();
      }
      size_t m = GrowthToLowerboundCapacity(n);
      resize(NormalizeCapacity(m));

      // This is after resize, to ensure that we have completed the allocation
      // and have potentially sampled the hashtable.
      infoz().RecordReservation(n);
    }
    common().reset_reserved_growth(n);
    common().set_reservation_size(n);
  }